

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  if (range._M_current != candidate._M_current) {
    do {
      p_Var1 = ((range._M_current)->
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
      if ((p_Var1 == ((range._M_current)->
                     super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                     ).
                     super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                     .m_End._M_node) ||
         (p_Var2 = ((candidate._M_current)->
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   ).
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_node,
         p_Var2 == ((candidate._M_current)->
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   ).
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_node)) {
LAB_0024b29b:
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<std::_List_iterator<char>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = std::_List_iterator<char>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      if (*(char *)&p_Var2[1]._M_next < *(char *)&p_Var1[1]._M_next) {
        skip_to_lower_bound<boost::iterator_range<std::_List_iterator<char>>,char,std::greater<void>>
                  (range._M_current,p_Var2 + 1);
        p_Var1 = ((range._M_current)->
                 super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                 ).
                 super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin._M_node;
        if (p_Var1 == ((range._M_current)->
                      super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                      ).
                      super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                      .m_End._M_node) {
          return (outer_range_iterator)range._M_current;
        }
        p_Var2 = ((candidate._M_current)->
                 super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                 ).
                 super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin._M_node;
        if (p_Var2 == ((candidate._M_current)->
                      super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                      ).
                      super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                      .m_End._M_node) goto LAB_0024b29b;
        if (*(char *)&p_Var1[1]._M_next < *(char *)&p_Var2[1]._M_next) {
          return (outer_range_iterator)range._M_current;
        }
      }
      range._M_current = range._M_current + 1;
    } while (range._M_current != candidate._M_current);
  }
  return (outer_range_iterator)range._M_current;
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }